

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

Gia_Obj_t * Gia_ManFraigMarkCis(Gia_Man_t *p,Gia_Obj_t *pObj,int fMark)

{
  int iVar1;
  Gia_Obj_t *pGStack_18;
  int fMark_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCi(pObj);
  pGStack_18 = pObj;
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweep.c"
                  ,0xe5,"Gia_Obj_t *Gia_ManFraigMarkCis(Gia_Man_t *, Gia_Obj_t *, int)");
  }
  while (iVar1 = Gia_ObjIsCi(pGStack_18), iVar1 != 0) {
    if (fMark != 0) {
      Gia_ObjSetTravIdCurrent(p,pGStack_18);
    }
    pGStack_18 = pGStack_18 + -1;
  }
  return pGStack_18;
}

Assistant:

Gia_Obj_t * Gia_ManFraigMarkCis( Gia_Man_t * p, Gia_Obj_t * pObj, int fMark )
{
    for ( assert( Gia_ObjIsCi(pObj) ); Gia_ObjIsCi(pObj); pObj-- )
        if ( fMark )
            Gia_ObjSetTravIdCurrent( p, pObj );
    return pObj;
}